

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O1

void __thiscall xemmai::t_script::f_scan(t_script *this,t_scan a_scan)

{
  _Elt_pointer ptVar1;
  int iVar2;
  _Elt_pointer ptVar3;
  t_slot *p;
  _Elt_pointer ptVar4;
  _Map_pointer pptVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->v_mutex);
  if (iVar2 == 0) {
    ptVar4 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    ptVar1 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ptVar4 != ptVar1) {
      ptVar3 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
      pptVar5 = (this->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        (*a_scan)((ptVar4->v_p)._M_b._M_p);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar3) {
          ptVar4 = pptVar5[1];
          pptVar5 = pptVar5 + 1;
          ptVar3 = ptVar4 + 0x40;
        }
      } while (ptVar4 != ptVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->v_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void t_script::f_scan(t_scan a_scan)
{
	std::lock_guard lock(v_mutex);
	for (auto& p : v_slots) a_scan(p);
}